

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCond.cpp
# Opt level: O1

void __thiscall Hpipe::InstructionCond::get_code_repr(InstructionCond *this,ostream *os)

{
  ostream *poVar1;
  string code;
  String local_60;
  String local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"d","");
  Cond::ok_cpp(&local_60,&this->cond,&local_40,&this->not_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"COND ",5);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,this->off_data);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void InstructionCond::get_code_repr( std::ostream &os ) {
    std::string code = cond.ok_cpp( "d", &not_in );
    os << "COND " << off_data << " " << code.size() << " " << code;
}